

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O0

bool __thiscall
NoMeEdgeCalculator::scoreReads
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,bool isClique,
          int numGCAllowedPos,int ct)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  byte in_CL;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  int returnVal;
  double tempScore;
  int second;
  int first;
  pair<int,_int> result;
  uint s22;
  uint s21;
  uint e22;
  uint e21;
  uint s12;
  uint s11;
  uint e12;
  uint e11;
  bool pe2;
  bool pe1;
  double scorePair2;
  double scorePair1;
  double score;
  undefined4 in_stack_ffffffffffffec88;
  undefined4 in_stack_ffffffffffffec8c;
  undefined4 in_stack_ffffffffffffed38;
  undefined4 in_stack_ffffffffffffed3c;
  AlignmentRecord *in_stack_ffffffffffffed40;
  undefined7 in_stack_ffffffffffffed48;
  undefined1 in_stack_ffffffffffffed4f;
  undefined4 in_stack_ffffffffffffed50;
  undefined4 in_stack_ffffffffffffed54;
  undefined4 in_stack_ffffffffffffed58;
  undefined4 in_stack_ffffffffffffed5c;
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [18];
  undefined1 in_stack_fffffffffffff362;
  undefined1 in_stack_fffffffffffff363;
  int in_stack_fffffffffffff364;
  string *in_stack_fffffffffffff368;
  string *in_stack_fffffffffffff370;
  string *in_stack_fffffffffffff378;
  string *in_stack_fffffffffffff380;
  NoMeEdgeCalculator *in_stack_fffffffffffff388;
  string local_c70 [16];
  int in_stack_fffffffffffff3a0;
  int in_stack_fffffffffffff3a8;
  int in_stack_fffffffffffff3b0;
  int in_stack_fffffffffffff3c8;
  int in_stack_fffffffffffff3d0;
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [36];
  int local_64c;
  double local_648;
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  int local_2c0;
  int local_2bc;
  pair<int,_int> local_2b8;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [39];
  byte local_229;
  string local_228 [32];
  string local_208 [39];
  byte local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  byte local_199;
  string local_198 [32];
  string local_178 [39];
  byte local_151;
  string local_150 [32];
  string local_130 [39];
  byte local_109;
  string local_108 [32];
  string local_e8 [35];
  byte local_c5;
  string local_b8 [32];
  string local_98 [36];
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  byte local_52;
  byte local_51;
  double local_50;
  double local_48;
  double local_40;
  byte local_29;
  AlignmentRecord *local_28;
  AlignmentRecord *local_20;
  
  local_29 = in_CL & 1;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_51 = AlignmentRecord::isPairedEnd(in_RSI);
  local_52 = AlignmentRecord::isPairedEnd(local_28);
  if (((local_51 & 1) != 0) && ((bool)local_52)) {
    local_58 = AlignmentRecord::getEnd1(local_20);
    local_5c = AlignmentRecord::getEnd2(local_20);
    local_60 = AlignmentRecord::getStart1(local_20);
    local_64 = AlignmentRecord::getStart2(local_20);
    local_68 = AlignmentRecord::getEnd1(local_28);
    local_6c = AlignmentRecord::getEnd2(local_28);
    local_70 = AlignmentRecord::getStart1(local_28);
    local_74 = AlignmentRecord::getStart2(local_28);
    if ((local_58 < local_70) && (local_5c < local_64)) {
      AlignmentRecord::getName_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      lVar4 = std::__cxx11::string::find((char *)local_98,0x3047ff);
      local_c5 = 0;
      if (lVar4 != -1) {
        AlignmentRecord::getName_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88))
        ;
        local_c5 = 1;
        std::__cxx11::string::find((char *)local_b8,0x3047ff);
      }
      if ((local_c5 & 1) != 0) {
        std::__cxx11::string::~string(local_b8);
      }
      std::__cxx11::string::~string(local_98);
      return false;
    }
    if ((local_68 < local_60) && (local_6c < local_64)) {
      AlignmentRecord::getName_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      lVar4 = std::__cxx11::string::find((char *)local_e8,0x3047ff);
      local_109 = 0;
      if (lVar4 != -1) {
        AlignmentRecord::getName_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88))
        ;
        local_109 = 1;
        std::__cxx11::string::find((char *)local_108,0x3047ff);
      }
      if ((local_109 & 1) != 0) {
        std::__cxx11::string::~string(local_108);
      }
      std::__cxx11::string::~string(local_e8);
      return false;
    }
    if ((local_68 < local_64) && (local_5c < local_74)) {
      AlignmentRecord::getName_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      lVar4 = std::__cxx11::string::find((char *)local_130,0x3047ff);
      local_151 = 0;
      if (lVar4 != -1) {
        AlignmentRecord::getName_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88))
        ;
        local_151 = 1;
        std::__cxx11::string::find((char *)local_150,0x3047ff);
      }
      if ((local_151 & 1) != 0) {
        std::__cxx11::string::~string(local_150);
      }
      std::__cxx11::string::~string(local_130);
      return false;
    }
    if ((local_58 < local_74) && (local_6c < local_64)) {
      AlignmentRecord::getName_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      lVar4 = std::__cxx11::string::find((char *)local_178,0x3047ff);
      local_199 = 0;
      if (lVar4 != -1) {
        AlignmentRecord::getName_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88))
        ;
        local_199 = 1;
        std::__cxx11::string::find((char *)local_198,0x3047ff);
      }
      if ((local_199 & 1) != 0) {
        std::__cxx11::string::~string(local_198);
      }
      std::__cxx11::string::~string(local_178);
      return false;
    }
    if ((local_68 < local_60) && (local_58 < local_74)) {
      AlignmentRecord::getName_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      lVar4 = std::__cxx11::string::find((char *)local_1c0,0x3047ff);
      local_1e1 = 0;
      if (lVar4 != -1) {
        AlignmentRecord::getName_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88))
        ;
        local_1e1 = 1;
        std::__cxx11::string::find((char *)local_1e0,0x3047ff);
      }
      if ((local_1e1 & 1) != 0) {
        std::__cxx11::string::~string(local_1e0);
      }
      std::__cxx11::string::~string(local_1c0);
      return false;
    }
    if ((local_58 < local_70) && (local_68 < local_64)) {
      AlignmentRecord::getName_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      lVar4 = std::__cxx11::string::find((char *)local_208,0x3047ff);
      local_229 = 0;
      if (lVar4 != -1) {
        AlignmentRecord::getName_abi_cxx11_
                  ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88))
        ;
        local_229 = 1;
        std::__cxx11::string::find((char *)local_228,0x3047ff);
      }
      if ((local_229 & 1) != 0) {
        std::__cxx11::string::~string(local_228);
      }
      std::__cxx11::string::~string(local_208);
      return false;
    }
  }
  bVar2 = AlignmentRecord::isSingleEnd(local_20);
  if ((bVar2) && (bVar2 = AlignmentRecord::isSingleEnd(local_28), bVar2)) {
    AlignmentRecord::getCode1_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getGcQuality1_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getCode1_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getGcQuality1_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getStart1(local_20);
    AlignmentRecord::getEnd1(local_20);
    AlignmentRecord::getStart1(local_28);
    AlignmentRecord::getEnd1(local_28);
    AlignmentRecord::isStrand1(local_20);
    local_40 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                              in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                              in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                              in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                              in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                              (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                              in_stack_fffffffffffff3d0);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string(local_250);
    if ((local_40 == 1.0) && (!NAN(local_40))) {
      return true;
    }
    return false;
  }
  bVar2 = AlignmentRecord::isSingleEnd(local_20);
  if (((!bVar2) || ((local_52 & 1) == 0)) &&
     (((local_51 & 1) == 0 || (bVar2 = AlignmentRecord::isSingleEnd(local_28), !bVar2)))) {
    local_648 = 0.0;
    if (((local_51 & 1) == 0) || ((local_52 & 1) == 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_64c = pairedReadDetermination
                          ((NoMeEdgeCalculator *)
                           CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58),
                           (AlignmentRecord *)
                           CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),
                           (AlignmentRecord *)
                           CONCAT17(in_stack_ffffffffffffed4f,in_stack_ffffffffffffed48));
    if (local_64c == 1) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_6d0);
      std::__cxx11::string::~string(local_6b0);
      std::__cxx11::string::~string(local_690);
      std::__cxx11::string::~string(local_670);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_750);
      std::__cxx11::string::~string(local_730);
      std::__cxx11::string::~string(local_710);
      std::__cxx11::string::~string(local_6f0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    else if ((local_64c == 2) || (local_64c == 8)) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_7d0);
      std::__cxx11::string::~string(local_7b0);
      std::__cxx11::string::~string(local_790);
      std::__cxx11::string::~string(local_770);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      uVar3 = AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_850);
      std::__cxx11::string::~string(local_830);
      std::__cxx11::string::~string(local_810);
      std::__cxx11::string::~string(local_7f0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_8d0);
      std::__cxx11::string::~string(local_8b0);
      std::__cxx11::string::~string(local_890);
      std::__cxx11::string::~string(local_870);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    else if ((local_64c == 3) || (local_64c == 9)) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_950);
      std::__cxx11::string::~string(local_930);
      std::__cxx11::string::~string(local_910);
      std::__cxx11::string::~string(local_8f0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_9d0);
      std::__cxx11::string::~string(local_9b0);
      std::__cxx11::string::~string(local_990);
      std::__cxx11::string::~string(local_970);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    else if ((local_64c == 4) || (local_64c == 5)) {
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart2(local_20);
      uVar3 = AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_a50);
      std::__cxx11::string::~string(local_a30);
      std::__cxx11::string::~string(local_a10);
      std::__cxx11::string::~string(local_9f0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_ad0);
      std::__cxx11::string::~string(local_ab0);
      std::__cxx11::string::~string(local_a90);
      std::__cxx11::string::~string(local_a70);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    else if (local_64c == 6) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_b50);
      std::__cxx11::string::~string(local_b30);
      std::__cxx11::string::~string(local_b10);
      std::__cxx11::string::~string(local_af0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_bd0);
      std::__cxx11::string::~string(local_bb0);
      std::__cxx11::string::~string(local_b90);
      std::__cxx11::string::~string(local_b70);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff3b0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff3d0);
      std::__cxx11::string::~string(local_c10);
      std::__cxx11::string::~string(local_bf0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    else if ((local_64c == 7) || (local_64c == 0xd)) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_cd0);
      std::__cxx11::string::~string(local_cb0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff370);
      std::__cxx11::string::~string(local_c70);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart1(local_20);
      AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_d50);
      std::__cxx11::string::~string(local_d30);
      std::__cxx11::string::~string(local_d10);
      std::__cxx11::string::~string(local_cf0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    else if ((local_64c == 10) || (local_64c == 0xb)) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_dd0);
      std::__cxx11::string::~string(local_db0);
      std::__cxx11::string::~string(local_d90);
      std::__cxx11::string::~string(local_d70);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_e50);
      std::__cxx11::string::~string(local_e30);
      std::__cxx11::string::~string(local_e10);
      std::__cxx11::string::~string(local_df0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    else if (local_64c == 0xc) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_ed0);
      std::__cxx11::string::~string(local_eb0);
      std::__cxx11::string::~string(local_e90);
      std::__cxx11::string::~string(local_e70);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_f50);
      std::__cxx11::string::~string(local_f30);
      std::__cxx11::string::~string(local_f10);
      std::__cxx11::string::~string(local_ef0);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_40 + local_648;
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_648 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                 in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                 in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                 in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                 (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_fd0);
      std::__cxx11::string::~string(local_fb0);
      std::__cxx11::string::~string(local_f90);
      std::__cxx11::string::~string(local_f70);
      if (local_648 < 0.0) {
        return false;
      }
      local_40 = local_648 + local_40;
    }
    return 2.0 <= local_40;
  }
  local_2b8 = mixedReadDetermination
                        ((NoMeEdgeCalculator *)
                         CONCAT17(in_stack_ffffffffffffed4f,in_stack_ffffffffffffed48),
                         in_stack_ffffffffffffed40,
                         (AlignmentRecord *)
                         CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
  local_2bc = local_2b8.first;
  local_2c0 = local_2b8.second;
  if ((local_2b8.first == 0) || (local_2b8.second == 0)) {
    return false;
  }
  if (local_2b8.first == 1) {
    if (local_2b8.second == 1) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_48 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string(local_2e0);
      local_50 = 0.0;
    }
    else if (local_2b8.second == 2) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_50 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_360);
      local_48 = 0.0;
    }
    else if (local_2b8.second == 3) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_48 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_440);
      std::__cxx11::string::~string(local_420);
      std::__cxx11::string::~string(local_400);
      std::__cxx11::string::~string(local_3e0);
      if ((local_48 == -1.0) && (!NAN(local_48))) {
        return false;
      }
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart1(local_20);
      AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart2(local_28);
      AlignmentRecord::getEnd2(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_50 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_4c0);
      std::__cxx11::string::~string(local_4a0);
      std::__cxx11::string::~string(local_480);
      std::__cxx11::string::~string(local_460);
      if ((local_50 == -1.0) && (!NAN(local_50))) {
        return false;
      }
    }
    else if (local_2b8.second == 4) {
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
      AlignmentRecord::getStart1(local_20);
      uVar3 = AlignmentRecord::getEnd1(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_48 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_540);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::string::~string(local_500);
      std::__cxx11::string::~string(local_4e0);
      if ((local_48 == -1.0) && (!NAN(local_48))) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality2_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getCode1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getGcQuality1_abi_cxx11_
                ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,uVar3));
      AlignmentRecord::getStart2(local_20);
      AlignmentRecord::getEnd2(local_20);
      AlignmentRecord::getStart1(local_28);
      AlignmentRecord::getEnd1(local_28);
      AlignmentRecord::isStrand1(local_20);
      local_50 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                                in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                                in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                                in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                                in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                                (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                                in_stack_fffffffffffff3d0);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::string::~string(local_5a0);
      std::__cxx11::string::~string(local_580);
      std::__cxx11::string::~string(local_560);
      if ((local_50 == -1.0) && (!NAN(local_50))) {
        return false;
      }
    }
  }
  else if (local_2b8.second == 1) {
    AlignmentRecord::getCode2_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getGcQuality2_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getCode1_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getGcQuality1_abi_cxx11_
              ((AlignmentRecord *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    AlignmentRecord::getStart2(local_20);
    AlignmentRecord::getEnd2(local_20);
    AlignmentRecord::getStart1(local_28);
    AlignmentRecord::getEnd1(local_28);
    AlignmentRecord::isStrand1(local_20);
    local_50 = scoreSequences(in_stack_fffffffffffff388,in_stack_fffffffffffff380,
                              in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                              in_stack_fffffffffffff368,in_stack_fffffffffffff364,
                              in_stack_fffffffffffff3a0,in_stack_fffffffffffff3a8,
                              in_stack_fffffffffffff3b0,(bool)in_stack_fffffffffffff363,
                              (bool)in_stack_fffffffffffff362,in_stack_fffffffffffff3c8,
                              in_stack_fffffffffffff3d0);
    std::__cxx11::string::~string(local_640);
    std::__cxx11::string::~string(local_620);
    std::__cxx11::string::~string(local_600);
    std::__cxx11::string::~string(local_5e0);
    local_48 = 0.0;
  }
  if (2.0 <= local_48 + local_50) {
    return true;
  }
  return false;
}

Assistant:

bool NoMeEdgeCalculator::scoreReads(const AlignmentRecord& ap1, const AlignmentRecord& ap2, bool isClique,int numGCAllowedPos, int ct) const{

    double score =0;

    double scorePair1 = 0;
    double scorePair2 = 0;


    bool pe1 = ap1.isPairedEnd();
    bool pe2 = ap2.isPairedEnd();

    // special cases of paired end reads for which no edge is allowed
    if(pe1 && pe2){

        unsigned int e11= ap1.getEnd1();
        unsigned int e12= ap1.getEnd2();
        unsigned int s11= ap1.getStart1();
        unsigned int s12= ap1.getStart2();
        unsigned int e21= ap2.getEnd1();
        unsigned int e22= ap2.getEnd2();
        unsigned int s21= ap2.getStart1();
        unsigned int s22= ap2.getStart2();
        //--------   ---------
        //           ---------   -------
        if(e11 < s21 && e12 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }

            return false;
        } //         ---------    ---------
        //-------    ---------
        else if(e21 < s11 && e22 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        } // ------------     ----------
        //   -----------                  ---------
        else if(e21 < s12 && e12 < s22){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//-----------            ----------
        //-----------  ----------
        else if(e11 < s22 && e22 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//          --------- ---------
        //----------           ---------
        else if (e21 < s11 && e11 < s22){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//--------             --------
        //           --------   --------
        else if(e11 < s21 && e21 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }
    }


    //Scoring for single ended cliques
     if(ap1.isSingleEnd() && ap2.isSingleEnd() ){
         score = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos, ct);
         if(score==1)return true;
         else return false;

     }



    //For mixed single and paired end cliques
    if((ap1.isSingleEnd() && pe2)||(pe1 && ap2.isSingleEnd())){
        std::pair<int , int> result =mixedReadDetermination(ap1,ap2);
        int first = result.first;
        int second = result.second;
        if(first==0||second==0){
            return false;
        }
        if(first==1){
            if(second==1){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair2 = 0;
            }else if(second == 2){
                scorePair2 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair1 = 0;
            }else if(second == 3){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair1 == -1) return false;
                //For the second Mate
                scorePair2 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair2 == -1) return false;
            }else if(second == 4){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair1 == -1) return false;
                //For the second Mate
                scorePair2=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair2 == -1) return false;
            }
        }else{
            if(second == 1){
                scorePair2 = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair1 = 0;
            }
        }

        if(scorePair1+scorePair2>=2)return true;
        else return false;


    }



     double tempScore = 0;
    //Scoring sequences for paired end cliques
    if(pe1&&pe2){
        int returnVal = pairedReadDetermination(ap1,ap2);
        if(returnVal == 1 ){
          tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
          if (tempScore < 0) return false;
          score += tempScore;
          tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
          if (tempScore < 0) return false;
          score += tempScore;
        }else if(returnVal == 2 || returnVal == 8){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 3 || returnVal == 9){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 4 || returnVal == 5){
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 6){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 7 || returnVal == 13){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            //For the second Mate
            tempScore=scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 10 || returnVal == 11){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            //For the second Mate
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 12){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }

        if(score>=2)return true;
        else return false;
    }



}